

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

bool __thiscall TCLAP::Arg::_hasBlanks(Arg *this,string *s)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  ulong in_RSI;
  int i;
  uint local_1c;
  
  local_1c = 1;
  while( true ) {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= local_1c) {
      return false;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    cVar1 = *pcVar4;
    cVar2 = blankChar();
    if (cVar1 == cVar2) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

inline bool Arg::_hasBlanks( const std::string& s ) const
{
	for ( int i = 1; static_cast<unsigned int>(i) < s.length(); i++ )
		if ( s[i] == Arg::blankChar() )
			return true;

	return false;
}